

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O0

void __thiscall
jaegertracing::reporters::Config::Config
          (Config *this,int queueSize,duration *bufferFlushInterval,bool logSpans,
          string *localAgentHostPort,string *endpoint)

{
  rep rVar1;
  duration dVar2;
  ulong uVar3;
  int local_5c;
  allocator local_39;
  string *local_38;
  string *endpoint_local;
  string *localAgentHostPort_local;
  duration *pdStack_20;
  bool logSpans_local;
  duration *bufferFlushInterval_local;
  Config *pCStack_10;
  int queueSize_local;
  Config *this_local;
  
  local_5c = queueSize;
  if (queueSize < 1) {
    local_5c = 100;
  }
  this->_queueSize = local_5c;
  local_38 = endpoint;
  endpoint_local = localAgentHostPort;
  localAgentHostPort_local._7_1_ = logSpans;
  pdStack_20 = bufferFlushInterval;
  bufferFlushInterval_local._4_4_ = queueSize;
  pCStack_10 = this;
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(bufferFlushInterval);
  if (rVar1 < 1) {
    dVar2 = defaultBufferFlushInterval();
    (this->_bufferFlushInterval).__r = dVar2.__r;
  }
  else {
    (this->_bufferFlushInterval).__r = pdStack_20->__r;
  }
  this->_logSpans = (bool)(localAgentHostPort_local._7_1_ & 1);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::string((string *)&this->_localAgentHostPort,(string *)endpoint_local);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&this->_localAgentHostPort,"127.0.0.1:6831",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  std::__cxx11::string::string((string *)&this->_endpoint,(string *)local_38);
  return;
}

Assistant:

explicit Config(
        int queueSize = kDefaultQueueSize,
        const Clock::duration& bufferFlushInterval =
            defaultBufferFlushInterval(),
        bool logSpans = false,
        const std::string& localAgentHostPort = kDefaultLocalAgentHostPort, const std::string& endpoint = kDefaultEndpoint)
        : _queueSize(queueSize > 0 ? queueSize : kDefaultQueueSize)
        , _bufferFlushInterval(bufferFlushInterval.count() > 0
                                   ? bufferFlushInterval
                                   : defaultBufferFlushInterval())
        , _logSpans(logSpans)
        , _localAgentHostPort(localAgentHostPort.empty()
                                  ? kDefaultLocalAgentHostPort
                                  : localAgentHostPort)
        , _endpoint(endpoint)
    {
    }